

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_use.cpp
# Opt level: O2

unique_ptr<duckdb::SetStatement,_std::default_delete<duckdb::SetStatement>,_true> __thiscall
duckdb::Transformer::TransformUse(Transformer *this,PGUseStmt *stmt)

{
  bool bVar1;
  ParserException *this_00;
  long in_RDX;
  pointer *__ptr;
  string *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string name;
  Value local_118;
  string local_d8;
  undefined1 local_b8 [32];
  string local_98;
  QualifiedName qualified_name;
  
  TransformQualifiedName(&qualified_name,(Transformer *)stmt,*(PGRangeVar **)(in_RDX + 8));
  bVar1 = IsInvalidCatalog(&qualified_name.catalog);
  if (bVar1) {
    name._M_dataplus._M_p = (pointer)&name.field_2;
    name._M_string_length = 0;
    name.field_2._M_local_buf[0] = '\0';
    bVar1 = IsInvalidSchema(&qualified_name.schema);
    if (bVar1) {
      KeywordHelper::WriteOptionallyQuoted((string *)&local_118,&qualified_name.name,'\"',true);
      this_01 = (string *)&local_118;
      ::std::__cxx11::string::operator=((string *)&name,this_01);
    }
    else {
      KeywordHelper::WriteOptionallyQuoted(&local_d8,&qualified_name.schema,'\"',true);
      ::std::operator+(&local_158,&local_d8,".");
      KeywordHelper::WriteOptionallyQuoted(&local_98,&qualified_name.name,'\"',true);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_118,&local_158,&local_98);
      ::std::__cxx11::string::operator=((string *)&name,(string *)&local_118);
      ::std::__cxx11::string::~string((string *)&local_118);
      ::std::__cxx11::string::~string((string *)&local_98);
      ::std::__cxx11::string::~string((string *)&local_158);
      this_01 = (string *)&local_d8;
    }
    ::std::__cxx11::string::~string(this_01);
    ::std::__cxx11::string::string((string *)local_b8,(string *)&name);
    Value::Value(&local_118,(string *)local_b8);
    make_uniq<duckdb::ConstantExpression,duckdb::Value>((duckdb *)&local_158,&local_118);
    Value::~Value(&local_118);
    ::std::__cxx11::string::~string((string *)local_b8);
    local_d8._M_dataplus._M_p._0_1_ = (string)0x0;
    make_uniq<duckdb::SetVariableStatement,char_const(&)[7],duckdb::unique_ptr<duckdb::ConstantExpression,std::default_delete<duckdb::ConstantExpression>,true>,duckdb::SetScope>
              ((duckdb *)&local_118,(char (*) [7])0x1fd1b6a,
               (unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                *)&local_158,(SetScope *)&local_d8);
    (this->parent).ptr = (Transformer *)local_118.type_._0_8_;
    if ((long *)local_158._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_158._M_dataplus._M_p + 8))();
    }
    ::std::__cxx11::string::~string((string *)&name);
    QualifiedName::~QualifiedName(&qualified_name);
    return (unique_ptr<duckdb::SetStatement,_std::default_delete<duckdb::SetStatement>_>)
           (unique_ptr<duckdb::SetStatement,_std::default_delete<duckdb::SetStatement>_>)this;
  }
  this_00 = (ParserException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_118,"Expected \"USE database\" or \"USE database.schema\"",
             (allocator *)&name);
  ParserException::ParserException(this_00,(string *)&local_118);
  __cxa_throw(this_00,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<SetStatement> Transformer::TransformUse(duckdb_libpgquery::PGUseStmt &stmt) {
	auto qualified_name = TransformQualifiedName(*stmt.name);
	if (!IsInvalidCatalog(qualified_name.catalog)) {
		throw ParserException("Expected \"USE database\" or \"USE database.schema\"");
	}
	string name;
	if (IsInvalidSchema(qualified_name.schema)) {
		name = KeywordHelper::WriteOptionallyQuoted(qualified_name.name, '"');
	} else {
		name = KeywordHelper::WriteOptionallyQuoted(qualified_name.schema, '"') + "." +
		       KeywordHelper::WriteOptionallyQuoted(qualified_name.name, '"');
	}
	auto name_expr = make_uniq<ConstantExpression>(Value(name));
	return make_uniq<SetVariableStatement>("schema", std::move(name_expr), SetScope::AUTOMATIC);
}